

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void start_monitoring_volume(void)

{
  undefined8 uVar1;
  long lVar2;
  
  uVar1 = pa_context_get_sink_info_by_index(pa,sink_index,got_sink_info,0);
  pa_operation_unref(uVar1);
  pa_context_set_subscribe_callback(pa,subscribe_cb,0);
  lVar2 = pa_context_subscribe(pa,1,0,0);
  if (lVar2 != 0) {
    pa_operation_unref(lVar2);
    return;
  }
  __assert_fail("op",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/main.cpp"
                ,0xc5,"void start_monitoring_volume()");
}

Assistant:

void start_monitoring_volume() {
    report_volume();

    pa_context_set_subscribe_callback(pa, subscribe_cb, NULL);
    pa_operation *op = pa_context_subscribe(pa, (pa_subscription_mask_t)
            (PA_SUBSCRIPTION_MASK_SINK), NULL, NULL);
    assert(op);
    pa_operation_unref(op);
}